

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_html.c
# Opt level: O0

int mpt_color_html(mpt_color *color,char *txt)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  int local_30;
  int local_2c;
  int i;
  int len;
  char part [4];
  uint8_t col [4];
  char *txt_local;
  mpt_color *color_local;
  
  len = -0x1000000;
  local_30 = 0;
  _part = txt;
  if (txt == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    color_local._4_4_ = -2;
  }
  else {
    i._2_1_ = 0;
    i._3_1_ = '\x04';
    local_2c = 0;
    do {
      cVar2 = i._3_1_ + -1;
      iVar3 = local_2c;
      if (i._3_1_ == '\0') {
LAB_001077c7:
        local_2c = iVar3;
        if (color != (mpt_color *)0x0) {
          i._3_1_ = cVar2;
          mpt_color_set(color,len & 0xff,(uint)len >> 8 & 0xff,(uint)len >> 0x10 & 0xff);
          mpt_color_setalpha(color,(uint)len >> 0x18);
        }
        return local_2c;
      }
      iVar3 = local_2c + 1;
      i._0_1_ = _part[local_2c];
      if ((char)i == '\0') goto LAB_001077c7;
      local_2c = local_2c + 2;
      i._1_1_ = _part[iVar3];
      if (i._1_1_ == '\0') {
        i._3_1_ = cVar2;
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        return -1;
      }
      i._3_1_ = cVar2;
      iVar3 = mpt_cuint8(part + (long)local_30 + -4,&i,0x10,0);
      local_30 = local_30 + 1;
    } while (-1 < iVar3);
    color_local._4_4_ = -1;
  }
  return color_local._4_4_;
}

Assistant:

extern int mpt_color_html(MPT_STRUCT(color) *color, const char *txt)
{
	uint8_t	col[4] = { 0, 0, 0, 255 };
	char	part[4];
	int	len, i = 0;
	
	if (!txt) {
		errno = EINVAL; return -2;
	}
	part[2] = '\0';
	part[3] = 4;
	len = 0;
	
	while (part[3]--) {
		if (!(part[0] = txt[len++]))
			break;
		
		if (!(part[1] = txt[len++])) {
			errno = EINVAL; return -1;
		}
		if (mpt_cuint8(&col[i++], part, 0x10, 0) < 0)
			return -1;
	}
	if (color) {
		mpt_color_set(color, col[0], col[1], col[2]);
		mpt_color_setalpha(color, col[3]);
	}
	return len;
}